

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

void __thiscall
TPZHybridizeHDiv::InsertPeriferalMaterialObjects
          (TPZHybridizeHDiv *this,TPZVec<TPZCompMesh_*> *meshvec_Hybrid)

{
  int iVar1;
  TPZCompMesh *pTVar2;
  ostream *poVar3;
  TPZMaterial *pTVar4;
  TPZNullMaterial<double> *pTVar5;
  
  if ((this->fLagrangeInterface != 0) && (this->fHDivWrapMatid != 0)) {
    pTVar2 = meshvec_Hybrid->fStore[1];
    iVar1 = pTVar2->fDimModel;
    pTVar4 = TPZCompMesh::FindMaterial(pTVar2,this->fLagrangeInterface);
    if (pTVar4 == (TPZMaterial *)0x0) {
      pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
      TPZNullMaterial<double>::TPZNullMaterial(pTVar5,this->fLagrangeInterface);
      TPZNullMaterial<double>::SetDimension(pTVar5,iVar1 + -1);
      pTVar5->fNState = this->fNState;
      TPZCompMesh::InsertMaterialObject(pTVar2,(TPZMaterial *)pTVar5);
    }
    pTVar4 = TPZCompMesh::FindMaterial(pTVar2,this->fLagrangeInterfaceEnd);
    if (pTVar4 == (TPZMaterial *)0x0) {
      pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
      TPZNullMaterial<double>::TPZNullMaterial(pTVar5,this->fLagrangeInterfaceEnd);
      TPZNullMaterial<double>::SetDimension(pTVar5,iVar1 + -1);
      pTVar5->fNState = this->fNState;
      TPZCompMesh::InsertMaterialObject(pTVar2,(TPZMaterial *)pTVar5);
    }
    pTVar2 = *meshvec_Hybrid->fStore;
    if (pTVar2 != (TPZCompMesh *)0x0) {
      pTVar4 = TPZCompMesh::FindMaterial(pTVar2,this->fHDivWrapMatid);
      if (pTVar4 == (TPZMaterial *)0x0) {
        pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
        TPZNullMaterial<double>::TPZNullMaterial(pTVar5,this->fHDivWrapMatid);
        TPZNullMaterial<double>::SetDimension(pTVar5,iVar1 + -1);
        pTVar5->fNState = this->fNState;
        TPZCompMesh::InsertMaterialObject(pTVar2,(TPZMaterial *)pTVar5);
        return;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
             ,0x31d);
}

Assistant:

void TPZHybridizeHDiv::InsertPeriferalMaterialObjects(TPZVec<TPZCompMesh *> &meshvec_Hybrid) {
    if (fLagrangeInterface == 0 || fHDivWrapMatid == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }


    TPZCompMesh *pressuremesh = meshvec_Hybrid[1];
    int dim = pressuremesh->Dimension();
    
    if (!pressuremesh->FindMaterial(fLagrangeInterface)) {
        auto matPerif = new TPZNullMaterial(fLagrangeInterface);
        matPerif->SetDimension(dim-1);
        matPerif->SetNStateVariables(fNState);
        pressuremesh->InsertMaterialObject(matPerif);
    }
    if (!pressuremesh->FindMaterial(fLagrangeInterfaceEnd)) {
        auto matPerif = new TPZNullMaterial(fLagrangeInterfaceEnd);
        matPerif->SetDimension(dim-1);
        matPerif->SetNStateVariables(fNState);
        pressuremesh->InsertMaterialObject(matPerif);
    }
    
    if(meshvec_Hybrid[0]!=NULL){

        TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
        if (!fluxmesh->FindMaterial(fHDivWrapMatid)) {
            auto matPerif = new TPZNullMaterial(fHDivWrapMatid);
            matPerif->SetDimension(dim-1);
            matPerif->SetNStateVariables(fNState);
            fluxmesh->InsertMaterialObject(matPerif);
        }
    }
}